

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O1

void __thiscall
kj::_::
HeapDisposer<kj::_::AdapterPromiseNode<capnproto_test::capnp::test::TestInterface::Client,_kj::_::PromiseAndFulfillerAdapter<capnproto_test::capnp::test::TestInterface::Client>_>_>
::disposeImpl(HeapDisposer<kj::_::AdapterPromiseNode<capnproto_test::capnp::test::TestInterface::Client,_kj::_::PromiseAndFulfillerAdapter<capnproto_test::capnp::test::TestInterface::Client>_>_>
              *this,void *pointer)

{
  void *pvVar1;
  long *plVar2;
  
  if (pointer != (void *)0x0) {
    pvVar1 = *(void **)((long)pointer + 0x1a8);
    if (*(long *)((long)pvVar1 + 0x10) == 0) {
      operator_delete(pvVar1,0x18);
    }
    else {
      *(undefined8 *)((long)pvVar1 + 0x10) = 0;
    }
    if ((*(char *)((long)pointer + 0x178) == '\x01') &&
       (plVar2 = *(long **)((long)pointer + 400), plVar2 != (long *)0x0)) {
      *(undefined8 *)((long)pointer + 400) = 0;
      (**(code **)**(undefined8 **)((long)pointer + 0x188))
                (*(undefined8 **)((long)pointer + 0x188),(long)plVar2 + *(long *)(*plVar2 + -0x10));
    }
    if (*(char *)((long)pointer + 0x18) == '\x01') {
      Exception::~Exception((Exception *)((long)pointer + 0x20));
    }
    operator_delete(pointer,0x1b0);
    return;
  }
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }